

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PathBezierQuadraticCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,int num_segments)

{
  ImVector<ImVec2> *path;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 *__src;
  ImVec2 IVar3;
  int iVar4;
  ImVec2 *__dest;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  float x1;
  float y1;
  float fVar11;
  float fVar12;
  float fVar13;
  
  path = &this->_Path;
  uVar9 = (ulong)(this->_Path).Size;
  IVar1 = (this->_Path).Data[uVar9 - 1];
  x1 = IVar1.x;
  y1 = IVar1.y;
  if (num_segments != 0) {
    if (0 < num_segments) {
      iVar5 = 1;
      do {
        IVar1 = *p2;
        IVar2 = *p3;
        iVar6 = (int)uVar9;
        if (iVar6 == (this->_Path).Capacity) {
          if (iVar6 == 0) {
            iVar4 = 8;
          }
          else {
            iVar4 = ((int)(((uint)(uVar9 >> 0x1f) & 1) + iVar6) >> 1) + iVar6;
          }
          iVar7 = iVar6 + 1;
          if (iVar6 + 1 < iVar4) {
            iVar7 = iVar4;
          }
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
          __src = (this->_Path).Data;
          if (__src != (ImVec2 *)0x0) {
            memcpy(__dest,__src,(long)(this->_Path).Size << 3);
            ImGui::MemFree((this->_Path).Data);
          }
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar7;
          iVar6 = (this->_Path).Size;
        }
        else {
          __dest = (this->_Path).Data;
        }
        fVar13 = (float)iVar5 * (1.0 / (float)num_segments);
        fVar11 = 1.0 - fVar13;
        fVar12 = (fVar11 + fVar11) * fVar13;
        IVar3.y = fVar13 * fVar13 * IVar2.y + fVar11 * fVar11 * y1 + fVar12 * IVar1.y;
        IVar3.x = fVar13 * fVar13 * IVar2.x + fVar11 * fVar11 * x1 + fVar12 * IVar1.x;
        __dest[iVar6] = IVar3;
        uVar8 = path->Size + 1;
        uVar9 = (ulong)uVar8;
        path->Size = uVar8;
        bVar10 = iVar5 != num_segments;
        iVar5 = iVar5 + 1;
      } while (bVar10);
    }
    return;
  }
  PathBezierQuadraticCurveToCasteljau
            (path,x1,y1,p2->x,p2->y,p3->x,p3->y,this->_Data->CurveTessellationTol,0);
  return;
}

Assistant:

void ImDrawList::PathBezierQuadraticCurveTo(const ImVec2& p2, const ImVec2& p3, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        IM_ASSERT(_Data->CurveTessellationTol > 0.0f);
        PathBezierQuadraticCurveToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, _Data->CurveTessellationTol, 0);// Auto-tessellated
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
            _Path.push_back(ImBezierQuadraticCalc(p1, p2, p3, t_step * i_step));
    }
}